

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void __thiscall Debugger::Attach(Debugger *this)

{
  ulong uVar1;
  anon_class_8_1_8991fb9c local_38;
  Executor local_30;
  Debugger *local_10;
  Debugger *this_local;
  
  if (((this->running & 1U) != 0) &&
     (local_10 = this, uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    local_38.this = this;
    std::function<void(lua_State*)>::function<Debugger::Attach()::__0,void>
              ((function<void(lua_State*)> *)&local_30,&local_38);
    ExecuteOnLuaThread(this,&local_30);
    std::function<void_(lua_State_*)>::~function(&local_30);
  }
  return;
}

Assistant:

void Debugger::Attach() {
	if (!running)
		return;

	// execute helper code
	if (!manager->helperCode.empty()) {
		ExecuteOnLuaThread([this](lua_State *L) {
			const int t = lua_gettop(L);
			// 判断是不是主lua_state
			int ret = lua_pushthread(L);
			if (ret == 1) {
				const int r = luaL_loadstring(L, manager->helperCode.c_str());
				if (r == LUA_OK) {
					if (lua_pcall(L, 0, 0, 0) != LUA_OK) {
						std::string msg = lua_tostring(L, -1);
						printf("msg: %s", msg.c_str());
					}
				}
			}
			lua_settop(L, t);
		});
	}
}